

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_mem mem_obj)

{
  char *fmt;
  char *pcVar1;
  cl_mem in_RDI;
  cl_int ret;
  cl_int local_4;
  
  if (in_RDI == (cl_mem)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pReleaseMemObject)(in_RDI);
    fmt = kErrorTemplate;
    if (local_4 != 0) {
      pcVar1 = OclError::toString(local_4);
      Log::print(ERR,fmt,pcVar1,kReleaseMemObject);
    }
  }
  return local_4;
}

Assistant:

cl_int xmrig::OclLib::release(cl_mem mem_obj) noexcept
{
    assert(pReleaseMemObject != nullptr);

    if (mem_obj == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~mem %zub", mem_obj, getUint(mem_obj, CL_MEM_REFERENCE_COUNT), getUlong(mem_obj, CL_MEM_SIZE));

    const cl_int ret = pReleaseMemObject(mem_obj);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseMemObject);
    }

    return ret;
}